

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O0

char * try_read_ld_version_string(FILE *fp)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  char *suffix_idx;
  char local_128 [4];
  int i_1;
  char buff [256];
  int i;
  int c;
  char glibc_version_prefix [4];
  FILE *fp_local;
  
  i = 0x2d646c;
  buff[0xfc] = '\x01';
  buff[0xfd] = '\0';
  buff[0xfe] = '\0';
  buff[0xff] = '\0';
  _c = (FILE *)fp;
  while( true ) {
    uVar3 = (ulong)(int)buff._252_4_;
    sVar4 = strlen((char *)&i);
    if (sVar4 <= uVar3) {
      memset(local_128,0,0x100);
      suffix_idx._4_4_ = 0;
      while (((suffix_idx._4_4_ < 0x100 && (iVar2 = fgetc(_c), iVar2 != 0)) && (iVar2 != -1))) {
        local_128[suffix_idx._4_4_] = (char)iVar2;
        suffix_idx._4_4_ = suffix_idx._4_4_ + 1;
      }
      pcVar5 = strstr(local_128,".so");
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
      _Var1 = is_linker_version_string_valid(local_128);
      if (_Var1) {
        fp_local = (FILE *)strdup(local_128);
      }
      else {
        fp_local = (FILE *)0x0;
      }
      return (char *)fp_local;
    }
    iVar2 = fgetc(_c);
    if (iVar2 != *(char *)((long)&i + (long)(int)buff._252_4_)) break;
    buff._252_4_ = buff._252_4_ + 1;
  }
  return (char *)0x0;
}

Assistant:

char *try_read_ld_version_string(FILE *fp) {
    char glibc_version_prefix[] = "ld-";
    int c = 0;
    for (int i = 1; i < strlen(glibc_version_prefix); i++) {
        c = fgetc(fp);
        if (c != glibc_version_prefix[i])
            return 0;
    }

    char buff[256] = {0x0};
    for (int i = 0; i < 256; i++) {
        c = fgetc(fp);
        if (c == '\0' || c == -1)
            break;

        buff[i] = c;
    }

    char *suffix_idx = strstr(buff, ".so");
    if (suffix_idx)
        *suffix_idx = 0;

    if (is_linker_version_string_valid(buff))
        return strdup(buff);

    return NULL;
}